

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O0

void __thiscall Track::clear(Track *this)

{
  Track local_30;
  Track *local_10;
  Track *this_local;
  
  local_10 = this;
  Track(&local_30,0);
  operator=(this,&local_30);
  ~Track(&local_30);
  return;
}

Assistant:

void Track::clear()
{
    *this = Track();
}